

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxNode *args_6;
  SyntaxNode *args_8;
  SyntaxNode *args_10;
  MemberSyntax *args_12;
  LoopGenerateSyntax *pLVar1;
  DeepCloneVisitor visitor_3;
  DeepCloneVisitor visitor;
  Token local_a0;
  Token local_90;
  Token local_80;
  Token local_70;
  Token local_60;
  DeepCloneVisitor visitor_2;
  DeepCloneVisitor visitor_1;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_70 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  local_80 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  local_90 = parsing::Token::deepClone((Token *)(__fn + 0x80),(BumpAllocator *)__child_stack);
  local_a0 = parsing::Token::deepClone((Token *)(__fn + 0x90),(BumpAllocator *)__child_stack);
  args_6 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0xa0),&visitor,(BumpAllocator *)__child_stack);
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0xa8),(BumpAllocator *)__child_stack);
  args_8 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0xb8),&visitor_1,(BumpAllocator *)__child_stack);
  _visitor_1 = parsing::Token::deepClone((Token *)(__fn + 0xc0),(BumpAllocator *)__child_stack);
  args_10 = detail::
            visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                      (*(SyntaxNode **)(__fn + 0xd0),&visitor_2,(BumpAllocator *)__child_stack);
  _visitor_2 = parsing::Token::deepClone((Token *)(__fn + 0xd8),(BumpAllocator *)__child_stack);
  args_12 = (MemberSyntax *)
            detail::
            visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                      (*(SyntaxNode **)(__fn + 0xe8),&visitor_3,(BumpAllocator *)__child_stack);
  pLVar1 = BumpAllocator::
           emplace<slang::syntax::LoopGenerateSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::MemberSyntax&>
                     ((BumpAllocator *)__child_stack,args,&local_60,&local_70,&local_80,&local_90,
                      &local_a0,(ExpressionSyntax *)args_6,(Token *)&visitor,
                      (ExpressionSyntax *)args_8,(Token *)&visitor_1,(ExpressionSyntax *)args_10,
                      (Token *)&visitor_2,args_12);
  return (int)pLVar1;
}

Assistant:

static SyntaxNode* clone(const LoopGenerateSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<LoopGenerateSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        node.genvar.deepClone(alloc),
        node.identifier.deepClone(alloc),
        node.equals.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.initialExpr, alloc),
        node.semi1.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.stopExpr, alloc),
        node.semi2.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.iterationExpr, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<MemberSyntax>(*node.block, alloc)
    );
}